

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

int elf_zstd_make_literal_baseline_fse
              (elf_zstd_fse_entry *fse_table,int table_bits,
              elf_zstd_fse_baseline_entry *baseline_table)

{
  byte bVar1;
  uchar uVar2;
  uint16_t uVar3;
  uint uVar4;
  elf_zstd_fse_entry *peVar5;
  uint16_t *puVar6;
  ulong uVar7;
  uchar uVar8;
  
  uVar7 = (ulong)(uint)(1 << ((byte)table_bits & 0x1f));
  peVar5 = fse_table + uVar7;
  puVar6 = &baseline_table[uVar7 - 1].base;
  do {
    if (peVar5 <= fse_table) {
      return 1;
    }
    bVar1 = peVar5[-1].symbol;
    uVar2 = peVar5[-1].bits;
    uVar3 = peVar5[-1].base;
    if (bVar1 < 0x10) {
      ((elf_zstd_fse_baseline_entry *)(puVar6 + -3))->baseline = (uint)bVar1;
      uVar8 = '\0';
    }
    else {
      if (0x23 < bVar1) {
        return 0;
      }
      uVar4 = elf_zstd_literal_length_base[bVar1 - 0x10];
      ((elf_zstd_fse_baseline_entry *)(puVar6 + -3))->baseline = uVar4 & 0xffffff;
      uVar8 = (uchar)(uVar4 >> 0x18);
    }
    *(uchar *)(puVar6 + -1) = uVar8;
    *(uchar *)((long)puVar6 + -1) = uVar2;
    *puVar6 = uVar3;
    puVar6 = puVar6 + -4;
    peVar5 = peVar5 + -1;
  } while( true );
}

Assistant:

static int
elf_zstd_make_literal_baseline_fse (
    const struct elf_zstd_fse_entry *fse_table,
    int table_bits,
    struct elf_zstd_fse_baseline_entry *baseline_table)
{
  size_t count;
  const struct elf_zstd_fse_entry *pfse;
  struct elf_zstd_fse_baseline_entry *pbaseline;

  /* Convert backward to avoid overlap.  */

  count = 1U << table_bits;
  pfse = fse_table + count;
  pbaseline = baseline_table + count;
  while (pfse > fse_table)
    {
      unsigned char symbol;
      unsigned char bits;
      uint16_t base;

      --pfse;
      --pbaseline;
      symbol = pfse->symbol;
      bits = pfse->bits;
      base = pfse->base;
      if (symbol < ZSTD_LITERAL_LENGTH_BASELINE_OFFSET)
	{
	  pbaseline->baseline = (uint32_t)symbol;
	  pbaseline->basebits = 0;
	}
      else
	{
	  unsigned int idx;
	  uint32_t basebits;

	  if (unlikely (symbol > 35))
	    {
	      elf_uncompress_failed ();
	      return 0;
	    }
	  idx = symbol - ZSTD_LITERAL_LENGTH_BASELINE_OFFSET;
	  basebits = elf_zstd_literal_length_base[idx];
	  pbaseline->baseline = ZSTD_DECODE_BASELINE(basebits);
	  pbaseline->basebits = ZSTD_DECODE_BASEBITS(basebits);
	}
      pbaseline->bits = bits;
      pbaseline->base = base;
    }

  return 1;
}